

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O2

Instr * __thiscall LowererMD::LoadArgumentsFromFrame(LowererMD *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *baseOpnd;
  IndirOpnd *newSrc;
  Func *func;
  StackSym *sym;
  
  bVar2 = Func::IsLoopBody(this->m_func);
  func = this->m_func;
  if (bVar2) {
    sym = func->m_loopParamSym;
    if (sym == (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,600,"(this->m_func->GetLoopParamSym())","this->m_func->GetLoopParamSym()")
      ;
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      func = this->m_func;
      sym = func->m_loopParamSym;
    }
    baseOpnd = IR::RegOpnd::New(sym,TyInt64,func);
    newSrc = IR::IndirOpnd::New(baseOpnd,0x40,TyInt64,this->m_func,false);
  }
  else {
    newSrc = (IndirOpnd *)CreateStackArgumentsSlotOpnd(func);
  }
  IR::Instr::SetSrc1(instr,&newSrc->super_Opnd);
  instr->m_opcode = MOV;
  return instr->m_prev;
}

Assistant:

IR::Instr *
LowererMD::LoadArgumentsFromFrame(IR::Instr * instr)
{
    if (this->m_func->IsLoopBody())
    {
        // Get the arguments ptr from the interpreter frame instance that was passed in.
        Assert(this->m_func->GetLoopParamSym());
        IR::RegOpnd *baseOpnd = IR::RegOpnd::New(this->m_func->GetLoopParamSym(), TyMachReg, this->m_func);
        int32 offset = (int32)Js::InterpreterStackFrame::GetOffsetOfArguments();
        instr->SetSrc1(IR::IndirOpnd::New(baseOpnd, offset, TyMachReg, this->m_func));
    }
    else
    {
        instr->SetSrc1(LowererMD::CreateStackArgumentsSlotOpnd(this->m_func));
    }

    instr->m_opcode = Js::OpCode::MOV;

    return instr->m_prev;
}